

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_cpc.cpp
# Opt level: O0

void SaveCDT_SnapshotWithPalette(path *fname,aint startAddr,byte screenMode,byte *palette)

{
  bool bVar1;
  byte *palette_local;
  byte screenMode_local;
  aint startAddr_local;
  path *fname_local;
  
  bVar1 = anon_unknown.dwarf_1b6c7::isCPC6128();
  if (bVar1) {
    createCDTDump6128(fname,startAddr,screenMode,palette);
  }
  else {
    createCDTDump464(fname,startAddr,screenMode,palette);
  }
  return;
}

Assistant:

static void SaveCDT_SnapshotWithPalette(const std::filesystem::path & fname,
										aint startAddr, byte screenMode, const byte* palette)
{
	isCPC6128() ?
		createCDTDump6128(fname, startAddr, screenMode, palette) :
		createCDTDump464(fname, startAddr, screenMode, palette);
}